

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

SerializationCompatibility * duckdb::SerializationCompatibility::Default(void)

{
  SerializationCompatibility *in_RDI;
  allocator local_31;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"v0.10.2",&local_31);
  FromString(in_RDI,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  in_RDI->manually_set = false;
  return in_RDI;
}

Assistant:

SerializationCompatibility SerializationCompatibility::Default() {
#ifdef DUCKDB_ALTERNATIVE_VERIFY
	auto res = FromString("latest");
	res.manually_set = false;
	return res;
#else
#ifdef DUCKDB_LATEST_STORAGE
	auto res = FromString("latest");
	res.manually_set = false;
	return res;
#else
	auto res = FromString("v0.10.2");
	res.manually_set = false;
	return res;
#endif
#endif
}